

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

string * __thiscall
gvr::PLYElement::toString_abi_cxx11_(string *__return_storage_ptr__,PLYElement *this)

{
  ostream *poVar1;
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"comment ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"element ",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->name)._M_dataplus._M_p,
                        (this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::ostream::_M_insert<long>((long)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string PLYElement::toString() const
{
  std::ostringstream s;

  if (size >= 0)
  {
    s << "element " << name << " " << size;
  }
  else
  {
    s << "comment " << name;
  }

  return s.str();
}